

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.cc
# Opt level: O3

void __thiscall
testing::Matcher<std::basic_string_view<char,_std::char_traits<char>_>_>::Matcher
          (Matcher<std::basic_string_view<char,_std::char_traits<char>_>_> *this,char *s)

{
  allocator<char> local_71;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  undefined8 uStack_58;
  MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_> local_50;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  (this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>).vtable_ =
       (VTable *)0x0;
  (this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>).buffer_.ptr =
       (void *)0x0;
  (this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001527b8;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,s,&local_71);
  local_70 = &local_60;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_38,local_30 + (long)local_38);
  local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00152b68;
  local_50.buffer_.ptr = (void *)0x0;
  local_50.vtable_ =
       (VTable *)
       internal::MatcherBase<std::basic_string_view<char,std::char_traits<char>>>::
       GetVTable<testing::internal::MatcherBase<std::basic_string_view<char,std::char_traits<char>>>::ValuePolicy<testing::internal::EqMatcher<std::__cxx11::string>,false>>()
       ::kVTable;
  local_50.buffer_.ptr = operator_new(0x28);
  ((local_50.buffer_.shared)->ref).super___atomic_base<int>._M_i = 1;
  *(undefined8 **)(local_50.buffer_.i + 8) = (undefined8 *)(local_50.buffer_.i + 0x18);
  if (local_70 == &local_60) {
    *(undefined8 *)(local_50.buffer_.i + 0x18) = CONCAT71(uStack_5f,local_60);
    *(undefined8 *)(local_50.buffer_.i + 0x20) = uStack_58;
  }
  else {
    *(undefined1 **)(local_50.buffer_.i + 8) = local_70;
    *(ulong *)(local_50.buffer_.i + 0x18) = CONCAT71(uStack_5f,local_60);
  }
  *(undefined8 *)(local_50.buffer_.i + 0x10) = local_68;
  local_68 = 0;
  local_60 = 0;
  local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001527b8;
  local_70 = &local_60;
  internal::MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>::operator=
            (&this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>,
             &local_50);
  internal::MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>::~MatcherBase
            (&local_50);
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return;
}

Assistant:

Matcher<internal::StringView>::Matcher(const char* s) {
  *this = Eq(std::string(s));
}